

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall.c
# Opt level: O0

void * metacallfs(void *func,char *buffer,size_t size,void *allocator)

{
  type_id tVar1;
  type_id tVar2;
  int iVar3;
  signature s_00;
  size_t sVar4;
  function_return pvVar5;
  type ptVar6;
  void *pvVar7;
  value pvVar8;
  long in_RDX;
  long in_RSI;
  function_conflict in_RDI;
  value cast_ret_1;
  type_id id_1;
  type t_1;
  size_t args_count;
  size_t iterator;
  value v;
  value ret_1;
  value *v_array;
  void *args [16];
  value cast_ret;
  type_id id;
  type t;
  value ret;
  signature s;
  function f;
  void *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  function_conflict in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  ulong local_f8;
  function_return local_e8;
  size_t in_stack_ffffffffffffff28;
  void **in_stack_ffffffffffffff30;
  void *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  type_id in_stack_ffffffffffffff44;
  value in_stack_ffffffffffffff48;
  function_return local_8;
  
  if (in_RDI == (function_conflict)0x0) {
    local_8 = (function_return)0x0;
  }
  else {
    s_00 = function_signature(in_RDI);
    if ((in_RSI == 0) || (in_RDX == 0)) {
      sVar4 = signature_count(s_00);
      if (sVar4 == 0) {
        pvVar5 = function_call(in_stack_fffffffffffffed8,
                               (void **)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0
                                                ),(size_t)in_stack_fffffffffffffec8);
        local_8 = pvVar5;
        if ((pvVar5 != (function_return)0x0) &&
           (ptVar6 = signature_get_return(s_00), ptVar6 != (type)0x0)) {
          tVar1 = type_index(ptVar6);
          tVar2 = value_type_id((value)CONCAT44(tVar1,in_stack_fffffffffffffee0));
          if ((tVar1 != tVar2) &&
             (local_8 = value_type_cast(in_stack_ffffffffffffff48,in_stack_ffffffffffffff44),
             local_8 == (value)0x0)) {
            local_8 = pvVar5;
          }
        }
      }
      else {
        local_8 = (function_return)0x0;
      }
    }
    else {
      metacall_serial();
      pvVar7 = metacall_deserialize
                         ((char *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                          (char *)in_stack_fffffffffffffed8,
                          CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                          in_stack_fffffffffffffec8);
      if (pvVar7 == (void *)0x0) {
        local_8 = (function_return)0x0;
      }
      else {
        tVar1 = value_type_id((value)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
        iVar3 = type_id_array(tVar1);
        if (iVar3 == 0) {
          sVar4 = value_type_count(in_stack_fffffffffffffec8);
          value_to_array((value)0x137b11);
          for (local_f8 = 0; local_f8 < sVar4; local_f8 = local_f8 + 1) {
            pvVar7 = metacall_value_copy((void *)0x137b3e);
            *(void **)(&stack0xffffffffffffff28 + local_f8 * 8) = pvVar7;
          }
          local_e8 = metacallfv_s(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                                  in_stack_ffffffffffffff28);
          for (local_f8 = 0; local_f8 < sVar4; local_f8 = local_f8 + 1) {
            value_type_destroy((value)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40))
            ;
          }
          value_type_destroy((value)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
          if ((local_e8 != (void *)0x0) &&
             (ptVar6 = signature_get_return(s_00), ptVar6 != (type)0x0)) {
            tVar1 = type_index(ptVar6);
            tVar2 = value_type_id((value)CONCAT44(in_stack_fffffffffffffee4,
                                                  in_stack_fffffffffffffee0));
            if ((tVar1 != tVar2) &&
               (pvVar8 = value_type_cast(in_stack_ffffffffffffff48,in_stack_ffffffffffffff44),
               pvVar8 != (value)0x0)) {
              local_e8 = pvVar8;
            }
          }
          local_8 = local_e8;
        }
        else {
          value_type_destroy((value)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
          local_8 = (function_return)0x0;
        }
      }
    }
  }
  return local_8;
}

Assistant:

void *metacallfs(void *func, const char *buffer, size_t size, void *allocator)
{
	function f = (function)func;

	if (f != NULL)
	{
		signature s = function_signature(f);

		if (buffer == NULL || size == 0)
		{
			if (signature_count(s) == 0)
			{
				value ret = function_call(f, metacall_null_args, 0);

				if (ret != NULL)
				{
					type t = signature_get_return(s);

					if (t != NULL)
					{
						type_id id = type_index(t);

						if (id != value_type_id(ret))
						{
							value cast_ret = value_type_cast(ret, id);

							return (cast_ret == NULL) ? ret : cast_ret;
						}
					}
				}

				return ret;
			}

			return NULL;
		}
		else
		{
			void *args[METACALL_ARGS_SIZE];

			value *v_array, ret, v = (value)metacall_deserialize(metacall_serial(), buffer, size, allocator);

			size_t iterator, args_count;

			if (v == NULL)
			{
				return NULL;
			}

			if (type_id_array(value_type_id(v)) != 0)
			{
				value_type_destroy(v);

				return NULL;
			}

			args_count = value_type_count(v);

			v_array = value_to_array(v);

			for (iterator = 0; iterator < args_count; ++iterator)
			{
				/* This step is necessary in order to handle type castings */
				args[iterator] = metacall_value_copy(v_array[iterator]);
			}

			ret = metacallfv_s(f, args, args_count);

			/* This step is necessary in order to handle type castings (otherwise it generates leaks) */
			for (iterator = 0; iterator < args_count; ++iterator)
			{
				value_type_destroy(args[iterator]);
			}

			value_type_destroy(v);

			if (ret != NULL)
			{
				type t = signature_get_return(s);

				if (t != NULL)
				{
					type_id id = type_index(t);

					if (id != value_type_id(ret))
					{
						value cast_ret = value_type_cast(ret, id);

						if (cast_ret != NULL)
						{
							ret = cast_ret;
						}
					}
				}
			}

			return ret;
		}
	}

	return NULL;
}